

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_branch(TCGContext_conflict9 *s,int call,tcg_insn_unit *dest)

{
  char cVar1;
  ptrdiff_t pVar2;
  uint32_t v;
  int opc;
  intptr_t disp;
  tcg_insn_unit *dest_local;
  int call_local;
  TCGContext_conflict9 *s_local;
  
  pVar2 = tcg_pcrel_diff(s,dest);
  v = (uint32_t)(pVar2 + -5);
  if (pVar2 + -5 == (long)(int)v) {
    opc = 0xe9;
    if (call != 0) {
      opc = 0xe8;
    }
    tcg_out_opc(s,opc,0,0,0);
    tcg_out32(s,v);
  }
  else {
    tcg_out_opc(s,0xff,0,0,0);
    cVar1 = '\x04';
    if (call != 0) {
      cVar1 = '\x02';
    }
    tcg_out8(s,cVar1 << 3 | 5);
    new_pool_label(s,(tcg_target_ulong)dest,2,s->code_ptr,-4);
    tcg_out32(s,0);
  }
  return;
}

Assistant:

static void tcg_out_branch(TCGContext *s, int call, tcg_insn_unit *dest)
{
    intptr_t disp = tcg_pcrel_diff(s, dest) - 5;

    if (disp == (int32_t)disp) {
        tcg_out_opc(s, call ? OPC_CALL_Jz : OPC_JMP_long, 0, 0, 0);
        tcg_out32(s, disp);
    } else {
        /* rip-relative addressing into the constant pool.
           This is 6 + 8 = 14 bytes, as compared to using an
           an immediate load 10 + 6 = 16 bytes, plus we may
           be able to re-use the pool constant for more calls.  */
        tcg_out_opc(s, OPC_GRP5, 0, 0, 0);
        tcg_out8(s, (call ? EXT5_CALLN_Ev : EXT5_JMPN_Ev) << 3 | 5);
        new_pool_label(s, (uintptr_t)dest, R_386_PC32, s->code_ptr, -4);
        tcg_out32(s, 0);
    }
}